

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O1

QString * QProcess::nullDevice(void)

{
  QString *in_RDI;
  
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = L"/dev/null";
  (in_RDI->d).size = 9;
  return in_RDI;
}

Assistant:

QString QProcess::nullDevice()
{
#ifdef Q_OS_WIN
    return QStringLiteral("\\\\.\\NUL");
#elif defined(_PATH_DEVNULL)
    return QStringLiteral(_PATH_DEVNULL);
#else
    return QStringLiteral("/dev/null");
#endif
}